

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string * __thiscall
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,anon_unknown_0 *this,xpath_node *na,
          xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  char *extraout_RAX;
  xpath_string *pxVar3;
  xpath_string *pxVar4;
  xml_node n;
  xpath_string local_48;
  
  pxVar2 = (xml_node_struct *)0x1432c3;
  if (na == (xpath_node *)0x0) {
    if (this == (anon_unknown_0 *)0x0) goto LAB_00132c88;
    na = (xpath_node *)this;
    if (3 < (*(uint *)this & 0xf) - 3) {
      if ((*(uint *)this & 0xf) - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        local_48._buffer = *(char_t **)(this + 0x10);
        if (local_48._buffer == (char *)0x0) {
          local_48._buffer = "";
        }
        if (*local_48._buffer != '\0') {
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          local_48._buffer = extraout_RAX;
        }
        pxVar4 = *(xpath_string **)(this + 0x20);
        if (pxVar4 == (xpath_string *)this || pxVar4 == (xpath_string *)0x0) {
          return (xpath_string *)
                 CONCAT71((int7)((ulong)local_48._buffer >> 8),pxVar4 == (xpath_string *)0x0);
        }
        while( true ) {
          if ((ulong)((uint)pxVar4->_buffer & 0xf) - 3 < 2) {
            local_48._buffer = (char_t *)pxVar4->_length_heap;
            if (local_48._buffer == (char *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          pxVar3 = *(xpath_string **)&pxVar4[1]._uses_heap;
          if ((pxVar3 == (xpath_string *)0x0) &&
             (pxVar3 = (xpath_string *)pxVar4[2]._buffer, pxVar3 == (xpath_string *)0x0)) {
            while( true ) {
              do {
                pxVar3 = pxVar4;
                pxVar4 = (xpath_string *)0x0;
              } while (pxVar3 == (xpath_string *)0x0);
              if ((pxVar3 == (xpath_string *)this) || (pxVar3[2]._buffer != (char_t *)0x0)) break;
              pxVar4 = (xpath_string *)pxVar3[1]._buffer;
            }
            if (pxVar3 != (xpath_string *)this) {
              pxVar3 = (xpath_string *)pxVar3[2]._buffer;
            }
          }
          if (pxVar3 == (xpath_string *)0x0) break;
          pxVar4 = pxVar3;
          if (pxVar3 == (xpath_string *)this) {
            return pxVar3;
          }
        }
        return (xpath_string *)0x0;
      }
      goto LAB_00132c88;
    }
  }
  pxVar1 = na[1]._node._root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar2 = pxVar1;
  }
LAB_00132c88:
  __return_storage_ptr__->_buffer = (char_t *)pxVar2;
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return (xpath_string *)pxVar2;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}